

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O1

void __thiscall CSocekt::inMsgRecvQueue(CSocekt *this,char *buf,int *imrqc)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  SourceFile file;
  Logger LStack_ff8;
  
  muduo::MutexLock::lock(&this->m_recvMessageQueueMutex);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)buf;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->m_MsgRecvQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl._M_node
            ._M_size;
  *psVar1 = *psVar1 + 1;
  LOCK();
  (this->m_iRecvMsgQueueCount).value_ = (this->m_iRecvMsgQueueCount).value_ + 1;
  UNLOCK();
  LOCK();
  iVar2 = (this->m_iRecvMsgQueueCount).value_;
  if (iVar2 == 0) {
    (this->m_iRecvMsgQueueCount).value_ = 0;
    iVar2 = 0;
  }
  UNLOCK();
  *imrqc = iVar2;
  if (muduo::g_logLevel < 3) {
    file._8_8_ = 0x16;
    file.data_ = "flyd_socket_request.cc";
    muduo::Logger::Logger(&LStack_ff8,file,0x11b);
    if (0x43 < (uint)(((int)&LStack_ff8 + 0xfb8) - (int)LStack_ff8.impl_.stream_.buffer_.cur_)) {
      memcpy(LStack_ff8.impl_.stream_.buffer_.cur_,anon_var_dwarf_350b5,0x43);
      LStack_ff8.impl_.stream_.buffer_.cur_ = LStack_ff8.impl_.stream_.buffer_.cur_ + 0x43;
    }
    muduo::Logger::~Logger(&LStack_ff8);
  }
  (this->m_recvMessageQueueMutex).holder_ = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_recvMessageQueueMutex);
  return;
}

Assistant:

void CSocekt::inMsgRecvQueue(char *buf, int &imrqc) //buf这段内存 ： 消息头 + 包头 + 包体
{
    muduo::MutexLockGuard lock(m_recvMessageQueueMutex);
    m_MsgRecvQueue.push_back(buf);

    m_iRecvMsgQueueCount.increment();

    imrqc = m_iRecvMsgQueueCount.get();
    
    //....其他功能待扩充，这里要记住一点，这里的内存都是要释放的，否则。。。。。。。。。。日后增加释放这些内存的代码
    //...而且逻辑处理应该要引入多线程，所以这里要考虑临界问题
    //....

    //临时在这里调用一下该函数，以防止接收消息队列过大
//    tmpoutMsgRecvQueue();   //.....临时，后续会取消这行代码

    //为了测试方便，因为本函数意味着收到了一个完整的数据包，所以这里打印一个信息
    LOG_INFO << "非常好，收到了一个完整的数据包【包头+包体】！";
}